

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O0

bool __thiscall webrtc::AudioProcessingImpl::is_fwd_processed(AudioProcessingImpl *this)

{
  uint uVar1;
  pointer pAVar2;
  pointer pHVar3;
  pointer pNVar4;
  pointer pEVar5;
  pointer pEVar6;
  pointer pGVar7;
  AudioProcessingImpl *this_local;
  
  if (((this->capture_nonlocked_).beamformer_enabled & 1U) == 0) {
    pAVar2 = std::
             unique_ptr<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
             ::operator->(&this->public_submodules_);
    pHVar3 = std::
             unique_ptr<webrtc::HighPassFilterImpl,_std::default_delete<webrtc::HighPassFilterImpl>_>
             ::operator->(&pAVar2->high_pass_filter);
    uVar1 = (*(pHVar3->super_HighPassFilter)._vptr_HighPassFilter[1])();
    if ((uVar1 & 1) == 0) {
      pAVar2 = std::
               unique_ptr<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
               ::operator->(&this->public_submodules_);
      pNVar4 = std::
               unique_ptr<webrtc::NoiseSuppressionImpl,_std::default_delete<webrtc::NoiseSuppressionImpl>_>
               ::operator->(&pAVar2->noise_suppression);
      uVar1 = (*(pNVar4->super_NoiseSuppression)._vptr_NoiseSuppression[1])();
      if ((uVar1 & 1) == 0) {
        pAVar2 = std::
                 unique_ptr<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                 ::operator->(&this->public_submodules_);
        pEVar5 = std::
                 unique_ptr<webrtc::EchoCancellationImpl,_std::default_delete<webrtc::EchoCancellationImpl>_>
                 ::operator->(&pAVar2->echo_cancellation);
        uVar1 = (*(pEVar5->super_EchoCancellation)._vptr_EchoCancellation[1])();
        if ((uVar1 & 1) == 0) {
          pAVar2 = std::
                   unique_ptr<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                   ::operator->(&this->public_submodules_);
          pEVar6 = std::
                   unique_ptr<webrtc::EchoControlMobileImpl,_std::default_delete<webrtc::EchoControlMobileImpl>_>
                   ::operator->(&pAVar2->echo_control_mobile);
          uVar1 = (*(pEVar6->super_EchoControlMobile)._vptr_EchoControlMobile[1])();
          if ((uVar1 & 1) == 0) {
            pAVar2 = std::
                     unique_ptr<webrtc::AudioProcessingImpl::ApmPublicSubmodules,_std::default_delete<webrtc::AudioProcessingImpl::ApmPublicSubmodules>_>
                     ::operator->(&this->public_submodules_);
            pGVar7 = std::
                     unique_ptr<webrtc::GainControlImpl,_std::default_delete<webrtc::GainControlImpl>_>
                     ::operator->(&pAVar2->gain_control);
            uVar1 = (*(pGVar7->super_GainControl)._vptr_GainControl[1])();
            if ((uVar1 & 1) == 0) {
              return false;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool AudioProcessingImpl::is_fwd_processed() const {
  // The beamformer, noise suppressor and highpass filter
  // modify the data.
  if (capture_nonlocked_.beamformer_enabled ||
      public_submodules_->high_pass_filter->is_enabled() ||
      public_submodules_->noise_suppression->is_enabled() ||
      public_submodules_->echo_cancellation->is_enabled() ||
      public_submodules_->echo_control_mobile->is_enabled() ||
      public_submodules_->gain_control->is_enabled()) {
    return true;
  }

  // The capture data is otherwise unchanged.
  return false;
}